

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_socket.c
# Opt level: O3

int qc_poll_remove(QcPoll *poll,unsigned_long index)

{
  pollfd *ppVar1;
  ulong uVar2;
  
  if (poll == (QcPoll *)0x0) {
    qc_poll_remove_cold_2();
  }
  else if (index != 0) {
    uVar2 = poll->num;
    if (index <= uVar2) {
      fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
              ,0x14e);
      uVar2 = poll->num;
      if (index <= uVar2) {
        __assert_fail("poll->num < index",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                      ,0x14e,"int qc_poll_remove(QcPoll *, unsigned long)");
      }
    }
    if (index < uVar2) {
      ppVar1 = poll->fdarray;
      do {
        ppVar1[index - 1] = ppVar1[index];
        index = index + 1;
      } while (uVar2 != index);
    }
    poll->num = uVar2 - 1;
    return 0;
  }
  qc_poll_remove_cold_1();
  return (int)poll->num;
}

Assistant:

int qc_poll_remove(QcPoll *poll, unsigned long index)
{
    unsigned long i;

    qc_assert(poll);
    qc_assert(index>0);
    qc_assert(poll->num < index);

    for(i = index; i<poll->num; i++)
    {
        poll->fdarray[i-1].fd = poll->fdarray[i].fd;
        poll->fdarray[i-1].events  = poll->fdarray[i].events;
        poll->fdarray[i-1].revents = poll->fdarray[i].revents;
    }

    poll->num--;
    return 0;
}